

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O2

UStringStream * __thiscall jsonnet::internal::UStringStream::operator<<(UStringStream *this,uint c)

{
  long lVar1;
  stringstream ss;
  long local_1d0;
  long local_1c8;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  for (lVar1 = 0; local_1c8 != lVar1; lVar1 = lVar1 + 1) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(&this->buf,(int)*(char *)(local_1d0 + lVar1));
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

UStringStream &operator<<(T c)
    {
        std::stringstream ss;
        ss << c;
        for (char c : ss.str())
            buf.push_back(char32_t(c));
        return *this;
    }